

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void anon_unknown.dwarf_84c48d::ListDependencies
               (cmDependInformation *info,FILE *fout,
               set<const_(anonymous_namespace)::cmDependInformation_*,_std::less<const_(anonymous_namespace)::cmDependInformation_*>,_std::allocator<const_(anonymous_namespace)::cmDependInformation_*>_>
               *visited)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  _Base_ptr p_Var4;
  cmDependInformation *info_00;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  _Base_ptr *pp_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string tmp;
  
  p_Var2 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
  bVar5 = true;
  pp_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  pp_Var9 = pp_Var1;
  p_Var7 = &p_Var2->_M_header;
  while (p_Var4 = *pp_Var9, p_Var4 != (_Base_ptr)0x0) {
    bVar5 = info < *(cmDependInformation **)(p_Var4 + 1);
    p_Var7 = p_Var4;
    pp_Var9 = &p_Var4->_M_left + (*(cmDependInformation **)(p_Var4 + 1) <= info);
  }
  p_Var6 = p_Var7;
  if (bVar5) {
    if (p_Var7 != (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var7);
      goto LAB_0025a476;
    }
  }
  else {
LAB_0025a476:
    if (info <= *(cmDependInformation **)(p_Var6 + 1)) goto LAB_0025a4b7;
  }
  if (p_Var2 == (_Rb_tree_header *)p_Var7) {
    bVar5 = true;
  }
  else {
    bVar5 = info < *(cmDependInformation **)(p_Var7 + 1);
  }
  p_Var6 = (_Rb_tree_node_base *)operator_new(0x28);
  *(cmDependInformation **)(p_Var6 + 1) = info;
  std::_Rb_tree_insert_and_rebalance(bVar5,p_Var6,p_Var7,&p_Var2->_M_header);
  psVar3 = &(visited->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *psVar3 = *psVar3 + 1;
LAB_0025a4b7:
  for (p_Var6 = (info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    info_00 = *(cmDependInformation **)(p_Var6 + 1);
    p_Var7 = &p_Var2->_M_header;
    pp_Var9 = pp_Var1;
    while (p_Var4 = *pp_Var9, p_Var4 != (_Base_ptr)0x0) {
      if (*(cmDependInformation **)(p_Var4 + 1) >= info_00) {
        p_Var7 = p_Var4;
      }
      pp_Var9 = &p_Var4->_M_left + (*(cmDependInformation **)(p_Var4 + 1) < info_00);
    }
    if (((_Rb_tree_header *)p_Var7 == p_Var2) || (info_00 < *(cmDependInformation **)(p_Var7 + 1)))
    {
      if ((info->FullPath)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&tmp,(string *)&info_00->FullPath);
        lVar8 = std::__cxx11::string::rfind((char)&tmp,0x2e);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&tmp);
          bVar5 = std::operator!=(&local_70,".h");
          std::__cxx11::string::~string((string *)&local_70);
          if (bVar5) {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)&tmp);
            std::__cxx11::string::operator=((string *)&tmp,(string *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            fprintf((FILE *)fout,"%s\n",(info_00->FullPath)._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::~string((string *)&tmp);
      }
      ListDependencies(info_00,fout,visited);
    }
  }
  return;
}

Assistant:

void ListDependencies(cmDependInformation const* info, FILE* fout,
                      std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation* d : info->DependencySet) {
    if (visited->find(d) == visited->end()) {
      if (!info->FullPath.empty()) {
        std::string tmp = d->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", d->FullPath.c_str());
        }
      }
      ListDependencies(d, fout, visited);
    }
  }
}